

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void remove_aug(lys_node_augment *augment)

{
  ushort uVar1;
  lys_node *plVar2;
  lys_node *plVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  
  plVar2 = augment->target;
  if ((plVar2 != (lys_node *)0x0) && (uVar1 = augment->flags, (uVar1 & 1) == 0)) {
    plVar3 = augment->child;
    plVar5 = plVar3;
    if (plVar3 != (lys_node *)0x0) {
      do {
        plVar4 = plVar5;
        plVar5 = plVar4->next;
        if (plVar5 == (lys_node *)0x0) break;
      } while (plVar5->parent == (lys_node *)augment);
      plVar6 = plVar2->child;
      if (plVar2->child == plVar3) {
        plVar2->child = plVar5;
        plVar6 = plVar5;
      }
      plVar2 = plVar3->prev;
      if (plVar2->next != (lys_node *)0x0) {
        plVar2->next = plVar5;
        plVar5 = plVar4->next;
      }
      if ((plVar5 != (lys_node *)0x0) || (plVar5 = plVar6, plVar6 != (lys_node *)0x0)) {
        plVar5->prev = plVar2;
      }
      plVar3->prev = plVar4;
      plVar4->next = (lys_node *)0x0;
    }
    augment->flags = uVar1 | 1;
  }
  return;
}

Assistant:

static void
remove_aug(struct lys_node_augment *augment)
{
    struct lys_node *last, *elem;

    if (!augment->target || (augment->flags & LYS_NOTAPPLIED)) {
        /* skip not resolved augments OR already not applied augment */
        return;
    }

    elem = augment->child;
    if (elem) {
        LY_TREE_FOR(elem, last) {
            if (!last->next || (last->next->parent != (struct lys_node *)augment)) {
                break;
            }
        }
        /* elem is first augment child, last is the last child */

        /* parent child ptr */
        if (augment->target->child == elem) {
            augment->target->child = last->next;
        }

        /* parent child next ptr */
        if (elem->prev->next) {
            elem->prev->next = last->next;
        }

        /* parent child prev ptr */
        if (last->next) {
            last->next->prev = elem->prev;
        } else if (augment->target->child) {
            augment->target->child->prev = elem->prev;
        }

        /* update augment children themselves */
        elem->prev = last;
        last->next = NULL;
    }

    /* augment->target still keeps the resolved target, but for lys_augment_free()
     * we have to keep information that this augment is not applied to free its data */
    augment->flags |= LYS_NOTAPPLIED;
}